

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# contexts.h
# Opt level: O0

Result<unsigned_int> * __thiscall
wasm::WATParser::ParseDefsCtx::getLocalFromName
          (Result<unsigned_int> *__return_storage_ptr__,ParseDefsCtx *this,Name name)

{
  Name name_00;
  bool bVar1;
  Index local_114;
  string local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  Err local_b0;
  ParseDefsCtx *local_90;
  char *local_88;
  allocator<char> local_69;
  string local_68;
  Err local_48;
  ParseDefsCtx *local_28;
  ParseDefsCtx *this_local;
  Name name_local;
  
  local_88 = name.super_IString.str._M_str;
  local_90 = name.super_IString.str._M_len;
  local_28 = this;
  this_local = local_90;
  name_local.super_IString.str._M_len = (size_t)local_88;
  name_local.super_IString.str._M_str = (char *)__return_storage_ptr__;
  if (this->func == (Function *)0x0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_68,"cannot access locals outside of a function",&local_69);
    Lexer::err(&local_48,&this->in,&local_68);
    Result<unsigned_int>::Result(__return_storage_ptr__,&local_48);
    wasm::Err::~Err(&local_48);
    std::__cxx11::string::~string((string *)&local_68);
    std::allocator<char>::~allocator(&local_69);
  }
  else {
    bVar1 = Function::hasLocalIndex(this->func,name);
    if (bVar1) {
      name_00.super_IString.str._M_str = (char *)name_local.super_IString.str._M_len;
      name_00.super_IString.str._M_len = (size_t)this_local;
      local_114 = Function::getLocalIndex(this->func,name_00);
      Result<unsigned_int>::Result<unsigned_int>(__return_storage_ptr__,&local_114);
    }
    else {
      IString::toString_abi_cxx11_(&local_110,(IString *)&this_local);
      std::operator+(&local_f0,"local $",&local_110);
      std::operator+(&local_d0,&local_f0," does not exist");
      Lexer::err(&local_b0,&this->in,&local_d0);
      Result<unsigned_int>::Result(__return_storage_ptr__,&local_b0);
      wasm::Err::~Err(&local_b0);
      std::__cxx11::string::~string((string *)&local_d0);
      std::__cxx11::string::~string((string *)&local_f0);
      std::__cxx11::string::~string((string *)&local_110);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Result<Index> getLocalFromName(Name name) {
    if (!func) {
      return in.err("cannot access locals outside of a function");
    }
    if (!func->hasLocalIndex(name)) {
      return in.err("local $" + name.toString() + " does not exist");
    }
    return func->getLocalIndex(name);
  }